

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O3

bool __thiscall s2polyline_alignment::Window::IsValid(Window *this)

{
  int iVar1;
  int iVar2;
  pointer pCVar3;
  pointer pCVar4;
  bool bVar5;
  pointer pCVar6;
  int iVar7;
  int iVar8;
  
  if ((((0 < this->rows_) && (0 < this->cols_)) &&
      (pCVar3 = (this->strides_).
                super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                ._M_impl.super__Vector_impl_data._M_start, pCVar3->start == 0)) &&
     (pCVar4 = (this->strides_).
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_finish, pCVar4[-1].end == this->cols_)) {
    if (pCVar3 == pCVar4) {
      return true;
    }
    iVar8 = -1;
    iVar7 = -1;
    do {
      pCVar6 = pCVar3 + 1;
      iVar1 = pCVar3->start;
      iVar2 = pCVar3->end;
      bVar5 = (iVar7 <= iVar2 && iVar8 <= iVar1) && iVar1 < iVar2;
      if ((iVar7 > iVar2 || iVar8 > iVar1) || iVar2 <= iVar1) {
        return bVar5;
      }
      iVar8 = iVar1;
      iVar7 = iVar2;
      pCVar3 = pCVar6;
    } while (pCVar6 != pCVar4);
    return bVar5;
  }
  return false;
}

Assistant:

bool Window::IsValid() const {
  if (rows_ <= 0 || cols_ <= 0 || strides_.front().start != 0 ||
      strides_.back().end != cols_) {
    return false;
  }

  ColumnStride prev = {-1, -1};
  for (const auto& curr : strides_) {
    if (curr.end <= curr.start || curr.start < prev.start ||
        curr.end < prev.end) {
      return false;
    }
    prev = curr;
  }
  return true;
}